

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O2

void InitRectifyMap(Mat *K,Mat *D,Mat *Knew,double xi,Size *size,RectMode mode,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  long lVar12;
  undefined1 auVar13 [16];
  double dVar14;
  int iVar15;
  long lVar16;
  int r;
  long lVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 local_658 [12];
  undefined4 uStack_64c;
  double local_618;
  double dStack_570;
  Size local_560;
  Size local_558;
  Mat Ki;
  Mat local_4f0 [16];
  long local_4e0;
  long *local_4a8;
  Mat local_490 [16];
  long local_480;
  long *local_448;
  Mat local_430 [16];
  long local_420;
  long *local_3e8;
  Mat local_3d0 [16];
  long local_3c0;
  long *local_388;
  Mat local_370 [16];
  long local_360;
  long *local_328;
  Mat local_310 [16];
  double *local_300;
  Mat local_2b0 [16];
  double *local_2a0;
  Mat local_250 [16];
  double *local_240;
  Mat local_1f0 [16];
  double *local_1e0;
  MatExpr local_190 [352];
  
  local_558 = *size;
  cv::Mat::create(map1,&local_558,5);
  local_560 = *size;
  cv::Mat::create(map2,&local_560,5);
  pdVar11 = *(double **)(K + 0x10);
  dVar1 = *pdVar11;
  dVar2 = pdVar11[1];
  dVar3 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 8);
  dVar4 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 0x10);
  dVar5 = pdVar11[2];
  pdVar11 = *(double **)(D + 0x10);
  dVar6 = *pdVar11;
  dVar7 = pdVar11[1];
  dVar8 = pdVar11[2];
  dVar9 = pdVar11[3];
  cv::Mat::inv((int)local_190);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&Ki);
  cv::MatExpr::~MatExpr(local_190);
  lVar17 = 0;
  do {
    if (size->height <= lVar17) {
      cv::Mat::~Mat(&Ki);
      return;
    }
    dVar14 = (double)(int)lVar17;
    auVar13._8_4_ = SUB84(dVar14,0);
    auVar13._0_8_ = dVar14;
    auVar13._12_4_ = (int)((ulong)dVar14 >> 0x20);
    for (lVar16 = 0; lVar16 < size->width; lVar16 = lVar16 + 1) {
      iVar15 = (int)lVar16;
      switch(mode) {
      case RECT_PERSPECTIVE:
        cv::Mat::Mat(local_310,&Ki);
        dVar19 = (double)iVar15;
        dVar21 = local_300[1];
        dVar20 = *local_300;
        dVar24 = local_300[2];
        cv::Mat::~Mat(local_310);
        cv::Mat::Mat(local_490,&Ki);
        lVar12 = *local_448;
        dVar22 = *(double *)(local_480 + lVar12);
        dVar23 = *(double *)(local_480 + 8 + lVar12);
        dVar10 = *(double *)(local_480 + 0x10 + lVar12);
        cv::Mat::~Mat(local_490);
        cv::Mat::Mat(local_4f0,&Ki);
        stack0xfffffffffffff9b0 = dVar20 * dVar19 + dVar21 * dVar14 + dVar24;
        local_658._0_8_ = dVar10 + dVar22 * dVar19 + dVar23 * dVar14;
        lVar12 = *local_4a8;
        dVar21 = dVar19 * *(double *)(local_4e0 + lVar12 * 2) +
                 *(double *)(local_4e0 + 8 + lVar12 * 2) * dVar14 +
                 *(double *)(local_4e0 + 0x10 + lVar12 * 2);
        cv::Mat::~Mat(local_4f0);
        break;
      case RECT_CYLINDRICAL:
        cv::Mat::Mat(local_1f0,&Ki);
        dVar21 = *local_1e0;
        dVar20 = local_1e0[1];
        dVar24 = local_1e0[2];
        cv::Mat::~Mat(local_1f0);
        cv::Mat::Mat(local_370,&Ki);
        dVar24 = dVar24 + dVar21 * (double)iVar15 + dVar20 * dVar14;
        lVar12 = *local_328;
        dVar22 = (double)iVar15 * *(double *)(local_360 + lVar12) +
                 *(double *)(local_360 + 8 + lVar12) * dVar14 +
                 *(double *)(local_360 + 0x10 + lVar12) + 0.2617993877991494;
        cv::Mat::~Mat(local_370);
        dVar21 = sin(dVar22);
        dVar20 = cos(dVar24);
        local_658._0_8_ = cos(dVar22);
        local_658._0_8_ = local_658._0_8_ ^ 0x8000000000000000;
        local_658._8_4_ = SUB84(dVar20 * -dVar21,0);
        uStack_64c = (int)((ulong)(dVar20 * -dVar21) >> 0x20);
        dVar20 = sin(dVar22);
        dVar21 = sin(dVar24);
        dVar21 = dVar21 * dVar20;
        break;
      case RECT_FISHEYE:
        dVar21 = (double)iVar15;
        dVar20 = hypot(dVar21 - *(double *)(*(long *)(Knew + 0x10) + 0x10),
                       dVar14 - *(double *)
                                 (*(long *)(Knew + 0x10) + 0x10 + **(long **)(Knew + 0x48)));
        if (dVar20 < **(double **)(Knew + 0x10) || dVar20 == **(double **)(Knew + 0x10)) {
          cv::Mat::Mat(local_250,&Ki);
          dVar20 = *local_240;
          dVar24 = local_240[1];
          dVar22 = local_240[2];
          cv::Mat::~Mat(local_250);
          cv::Mat::Mat(local_3d0,&Ki);
          lVar12 = *local_388;
          dStack_570 = auVar13._8_8_;
          dVar23 = dVar21 * *(double *)(local_3c0 + lVar12) +
                   *(double *)(local_3c0 + 8 + lVar12) * dVar14 +
                   *(double *)(local_3c0 + 0x10 + lVar12);
          dVar22 = dVar21 * dVar20 + dVar24 * dStack_570 + dVar22;
          cv::Mat::~Mat(local_3d0);
          dVar21 = 2.0 / (dVar22 * dVar22 + dVar23 * dVar23 + 1.0);
          local_658._0_8_ = dVar21 * dVar23;
          register0x00001388 = dVar21 * dVar22;
          dVar21 = dVar21 + -1.0;
          break;
        }
        *(undefined4 *)(**(long **)(map1 + 0x48) * lVar17 + *(long *)(map1 + 0x10) + lVar16 * 4) =
             0xbf800000;
        fVar18 = -1.0;
        goto LAB_0010514d;
      case RECT_LONGLAT:
        cv::Mat::Mat(local_2b0,&Ki);
        dVar21 = *local_2a0;
        dVar20 = local_2a0[1];
        dVar24 = local_2a0[2];
        cv::Mat::~Mat(local_2b0);
        cv::Mat::Mat(local_430,&Ki);
        dVar24 = dVar24 + dVar21 * (double)iVar15 + dVar20 * dVar14;
        lVar12 = *local_3e8;
        dVar22 = (double)iVar15 * *(double *)(local_420 + lVar12) +
                 *(double *)(local_420 + 8 + lVar12) * dVar14 +
                 *(double *)(local_420 + 0x10 + lVar12);
        cv::Mat::~Mat(local_430);
        dVar21 = cos(dVar24);
        local_618 = sin(dVar24);
        local_618 = -local_618;
        dVar20 = cos(dVar22);
        local_658._8_4_ = SUB84(dVar21,0);
        local_658._0_8_ = dVar20 * local_618;
        uStack_64c = (uint)((ulong)dVar21 >> 0x20) ^ 0x80000000;
        dVar20 = sin(dVar24);
        dVar21 = sin(dVar22);
        dVar21 = dVar21 * dVar20;
        break;
      default:
        _local_658 = ZEXT816(0);
        dVar21 = 0.0;
      }
      dVar20 = SQRT(dVar21 * dVar21 +
                    local_658._8_8_ * local_658._8_8_ + local_658._0_8_ * local_658._0_8_);
      dVar21 = dVar21 / dVar20 + xi;
      auVar25._8_8_ = dVar20;
      auVar25._0_8_ = dVar20;
      auVar25 = divpd(_local_658,auVar25);
      auVar26._8_4_ = SUB84(dVar21,0);
      auVar26._0_8_ = dVar21;
      auVar26._12_4_ = (int)((ulong)dVar21 >> 0x20);
      auVar26 = divpd(auVar25,auVar26);
      dVar22 = auVar26._0_8_;
      dVar23 = auVar26._8_8_;
      dVar20 = dVar23 * dVar23 + dVar22 * dVar22;
      dVar21 = dVar6 * dVar20 + 1.0 + dVar20 * dVar20 * dVar7;
      dVar24 = ((dVar22 + dVar22) * dVar22 + dVar20) * dVar8 +
               dVar21 * dVar22 + dVar23 * (dVar9 + dVar9) * dVar22;
      *(float *)(**(long **)(map1 + 0x48) * lVar17 + *(long *)(map1 + 0x10) + lVar16 * 4) =
           (float)(dVar2 * dVar24 +
                   (((dVar23 + dVar23) * dVar23 + dVar20) * dVar9 +
                   dVar21 * dVar23 + (dVar8 + dVar8) * dVar23 * dVar22) * dVar1 + dVar5);
      fVar18 = (float)(dVar24 * dVar3 + dVar4);
LAB_0010514d:
      *(float *)(**(long **)(map2 + 0x48) * lVar17 + *(long *)(map2 + 0x10) + lVar16 * 4) = fVar18;
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void InitRectifyMap(cv::Mat K,
                    cv::Mat D,
                    cv::Mat Knew,
                    double xi,
                    cv::Size size,
                    RectMode mode,
                    cv::Mat& map1,
                    cv::Mat& map2) {
  map1.create(size, CV_32F);
  map2.create(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat Ki  = Knew.inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = 0.;
      double yc = 0.;
      double zc = 0.;

      if (mode == RECT_PERSPECTIVE) {
        xc = MatRowMul(Ki, c, r, 1., 0);
        yc = MatRowMul(Ki, c, r, 1., 1);
        zc = MatRowMul(Ki, c, r, 1., 2);
      }

      if (mode == RECT_CYLINDRICAL) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1) + MARGIN;

        xc = -sin(pp) * cos(tt);
        yc = -cos(pp);
        zc =  sin(pp) * sin(tt);
      }

      if (mode == RECT_FISHEYE) {
        if (hypot(c - Knew.at<double>(0, 2), r - Knew.at<double>(1, 2))
            > Knew.at<double>(0, 0)) {
          map1.at<float>(r,c) = -1.f;
          map2.at<float>(r,c) = -1.f;
          continue;
        }
        double ee = MatRowMul(Ki, c, r, 1., 0);
        double ff = MatRowMul(Ki, c, r, 1., 1);

        double zz = 2. / (ee * ee + ff * ff + 1.);

        xc = zz * ee;
        yc = zz * ff;
        zc = zz - 1.;
      }

      if (mode == RECT_LONGLAT) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1);

        xc = -cos(tt);
        yc = -sin(tt) * cos(pp);
        zc =  sin(tt) * sin(pp);
      }

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xi);
      double yu = ys / (zs + xi);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}